

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glib_compat.c
# Opt level: O2

gchar ** g_strsplit(gchar *string,gchar *delimiter,gint max_tokens)

{
  char *pcVar1;
  size_t sVar2;
  char *data;
  GSList *list;
  gchar **ppgVar3;
  _GSList *p_Var4;
  uint uVar5;
  gchar *pgVar6;
  int iVar7;
  
  if ((delimiter == (gchar *)0x0 || string == (gchar *)0x0) || (uVar5 = 0, *delimiter == '\0')) {
    ppgVar3 = (gchar **)0x0;
  }
  else {
    pcVar1 = strstr(string,delimiter);
    pgVar6 = string;
    if (pcVar1 == (char *)0x0) {
      list = (GSList *)0x0;
    }
    else {
      iVar7 = 0x7fffffff;
      if (0 < max_tokens) {
        iVar7 = max_tokens;
      }
      sVar2 = strlen(delimiter);
      uVar5 = 0;
      list = (GSList *)0x0;
      while ((iVar7 - 1U != uVar5 && (pcVar1 != (char *)0x0))) {
        data = g_strndup(pgVar6,(long)pcVar1 - (long)pgVar6);
        list = g_slist_prepend(list,data);
        uVar5 = uVar5 + 1;
        pgVar6 = pcVar1 + sVar2;
        pcVar1 = strstr(pgVar6,delimiter);
      }
    }
    if (*string != '\0') {
      uVar5 = uVar5 + 1;
      pcVar1 = g_strdup(pgVar6);
      list = g_slist_prepend(list,pcVar1);
    }
    ppgVar3 = (gchar **)g_malloc_n((ulong)(uVar5 + 1),8);
    ppgVar3[uVar5] = (gchar *)0x0;
    for (p_Var4 = list; uVar5 = uVar5 - 1, p_Var4 != (GSList *)0x0; p_Var4 = p_Var4->next) {
      ppgVar3[uVar5] = (gchar *)p_Var4->data;
    }
    g_slist_free(list);
  }
  return ppgVar3;
}

Assistant:

gchar** g_strsplit (const gchar *string,
        const gchar *delimiter,
        gint         max_tokens)
{
    GSList *string_list = NULL, *slist;
    gchar **str_array, *s;
    guint n = 0;
    const gchar *remainder;

    if (string == NULL) return NULL;
    if (delimiter == NULL) return NULL;
    if (delimiter[0] == '\0') return NULL;

    if (max_tokens < 1)
        max_tokens = G_MAXINT;

    remainder = string;
    s = strstr (remainder, delimiter);
    if (s)
    {
        gsize delimiter_len = strlen (delimiter);

        while (--max_tokens && s)
        {
            gsize len;

            len = s - remainder;
            string_list = g_slist_prepend (string_list,
                    g_strndup (remainder, len));
            n++;
            remainder = s + delimiter_len;
            s = strstr (remainder, delimiter);
        }
    }
    if (*string)
    {
        n++;
        string_list = g_slist_prepend (string_list, g_strdup (remainder));
    }

    str_array = g_new (gchar*, n + 1);

    str_array[n--] = NULL;
    for (slist = string_list; slist; slist = slist->next)
        str_array[n--] = slist->data;

    g_slist_free (string_list);

    return str_array;
}